

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.c
# Opt level: O0

void inter_modes_info_sort(InterModesInfo *inter_modes_info,RdIdxPair *rd_idx_pair_arr)

{
  void *in_RSI;
  int *in_RDI;
  int i;
  int local_14;
  
  if (*in_RDI != 0) {
    for (local_14 = 0; local_14 < *in_RDI; local_14 = local_14 + 1) {
      *(int *)((long)in_RSI + (long)local_14 * 0x10) = local_14;
      *(undefined8 *)((long)in_RSI + (long)local_14 * 0x10 + 8) =
           *(undefined8 *)(in_RDI + (long)local_14 * 2 + 0xbc02);
    }
    qsort(in_RSI,(long)*in_RDI,0x10,compare_rd_idx_pair);
  }
  return;
}

Assistant:

static inline void inter_modes_info_sort(const InterModesInfo *inter_modes_info,
                                         RdIdxPair *rd_idx_pair_arr) {
  if (inter_modes_info->num == 0) {
    return;
  }
  for (int i = 0; i < inter_modes_info->num; ++i) {
    rd_idx_pair_arr[i].idx = i;
    rd_idx_pair_arr[i].rd = inter_modes_info->est_rd_arr[i];
  }
  qsort(rd_idx_pair_arr, inter_modes_info->num, sizeof(rd_idx_pair_arr[0]),
        compare_rd_idx_pair);
}